

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_interp_decode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  undefined8 *puVar1;
  long lVar2;
  uint64_t *puVar3;
  int64_t *piVar4;
  stack *psVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *__s;
  size_t __size;
  long lVar8;
  stack *psVar9;
  long in_R8;
  long lVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  
  *A = 0;
  A[n] = 0x8000000;
  lVar6 = LZCOUNT(n - 1);
  uVar15 = 0x40 - lVar6;
  if (n - 1 == 0) {
    uVar15 = 0;
  }
  if (shuff_interp_decode::ss <= uVar15) {
    __size = uVar15 * 0x10 + 0x10;
    psVar5 = (stack *)realloc(shuff_interp_decode::s,__size);
    if (psVar5 == (stack *)0x0) {
      psVar9 = shuff_interp_decode::s;
      shuff_interp_decode::s = psVar5;
      shuff_interp_decode();
      if (-1 < in_R8) {
        puVar1 = (undefined8 *)((long)__s + in_R8 * 8 + 1);
        puVar7 = __s + 1;
        if (__s + 1 < puVar1) {
          puVar7 = puVar1;
        }
        memset(__s,0,(~(ulong)__s + (long)puVar7 & 0xfffffffffffffff8) + 8);
      }
      if ((long)__size < 1) {
        lVar8 = 0;
      }
      else {
        piVar4 = &psVar9->lo;
        lVar8 = 0;
        do {
          uVar15 = (ulong)((int)psVar9->lo + 1);
          if (__s[uVar15] == 0) {
            *(ulong *)(lVar6 + lVar8 * 8) = uVar15;
            lVar8 = lVar8 + 1;
          }
          __s[uVar15] = __s[uVar15] + 1;
          psVar9 = (stack *)((long)&psVar9->lo + 4);
        } while (psVar9 < (stack *)((long)piVar4 + __size * 4));
      }
      *__s = 1;
      *(undefined8 *)(lVar6 + lVar8 * 8) = 0;
      return;
    }
    shuff_interp_decode::ss = uVar15 + 1;
    shuff_interp_decode::s = psVar5;
  }
  psVar5 = shuff_interp_decode::s;
  shuff_interp_decode::s->lo = 0;
  psVar5->hi = n;
  lVar6 = 1;
  do {
    lVar8 = psVar5[lVar6 + -1].lo;
    lVar2 = psVar5[lVar6 + -1].hi;
    lVar10 = A[lVar2] - (A[lVar8] + (lVar2 - lVar8));
    uVar12 = 1;
    if (lVar10 + 1 != 1) {
      lVar14 = 0x40 - LZCOUNT(lVar10);
      if (lVar10 == 0) {
        lVar14 = 0;
      }
      uVar15 = lVar14 - 1;
      if (uVar15 == 0) {
        uVar13 = 0;
      }
      else {
        uVar11 = bio->buff_btg;
        if (uVar11 == 0x40) {
          uVar12 = *bio->in_u64;
        }
        else {
          uVar12 = *bio->in_u64 << ((ulong)(byte)-(char)uVar11 & 0x3f);
        }
        uVar13 = uVar12 >> ((ulong)(byte)(0x41 - (char)lVar14) & 0x3f);
        uVar12 = uVar11 - uVar15;
        if (uVar11 < uVar15 || uVar12 == 0) {
          lVar16 = uVar15 - uVar11;
          puVar3 = bio->in_u64;
          bio->in_u64 = puVar3 + 1;
          bio->buff_btg = 0x40;
          if (0 < lVar16) {
            uVar12 = 0x40 - lVar16;
            uVar13 = uVar13 | puVar3[1] >> (-lVar16 & 0x3fU);
            goto LAB_0011f9af;
          }
        }
        else {
LAB_0011f9af:
          bio->buff_btg = uVar12;
        }
        if (bio->buff_btg == 0) {
          bio->in_u64 = bio->in_u64 + 1;
          bio->buff_btg = 0x40;
        }
      }
      lVar10 = (long)(1 << ((uint)lVar14 & 0x1f)) - (lVar10 + 1);
      if (lVar10 <= (long)uVar13) {
        uVar11 = bio->buff_btg - 1;
        bio->buff_btg = uVar11;
        uVar15 = *bio->in_u64;
        if (uVar11 == 0) {
          bio->in_u64 = bio->in_u64 + 1;
          bio->buff_btg = 0x40;
        }
        uVar13 = (uVar13 * 2 - lVar10) + (ulong)((uVar15 >> (uVar11 & 0x3f) & 1) != 0);
      }
      uVar12 = uVar13 + 1;
    }
    lVar10 = lVar6 + -1;
    lVar16 = lVar2 - lVar8 >> 1;
    lVar14 = lVar16 + lVar8;
    A[lVar14] = uVar12;
    uVar12 = (uVar12 - 1) + A[lVar8] + lVar16;
    A[lVar14] = uVar12;
    if (A[lVar2] - uVar12 == lVar2 - lVar14) {
      lVar6 = lVar14 + 1;
      if (lVar6 < lVar2) {
        uVar12 = A[lVar14];
        do {
          uVar12 = uVar12 + 1;
          A[lVar6] = uVar12;
          lVar6 = lVar6 + 1;
        } while (lVar6 < lVar2);
      }
    }
    else if (1 < lVar2 - lVar14) {
      psVar5[lVar10].lo = lVar14;
      psVar5[lVar10].hi = lVar2;
      lVar10 = lVar6;
    }
    lVar6 = lVar10;
    if (A[lVar14] - A[lVar8] == lVar16) {
      if (1 < lVar16) {
        uVar12 = A[lVar8];
        lVar8 = lVar8 + 1;
        do {
          uVar12 = uVar12 + 1;
          A[lVar8] = uVar12;
          lVar8 = lVar8 + 1;
        } while (lVar8 < lVar14);
      }
    }
    else if (1 < lVar16) {
      psVar5[lVar6].lo = lVar8;
      psVar5[lVar6].hi = lVar14;
      lVar6 = lVar6 + 1;
    }
    if (lVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void shuff_interp_decode(bit_io_t* bio, uint64_t A[], uint64_t n)
{
    int64_t lo, hi, mid, range, j;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_DECODE(bio, A[mid], range);
        A[mid] += A[lo] + (mid - lo - 1);

        if (A[hi] - A[mid] == (uint64_t)(hi - mid)) // fill in the gaps of 1
            for (j = mid + 1; j < hi; j++)
                A[j] = A[j - 1] + 1;
        else if (hi - mid > 1)
            SHUFF_PUSH(mid, hi);

        if (A[mid] - A[lo] == (uint64_t)(mid - lo)) // fill in the gaps of 1
            for (j = lo + 1; j < mid; j++)
                A[j] = A[j - 1] + 1;
        else if (mid - lo > 1)
            SHUFF_PUSH(lo, mid);
    }
}